

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void av1_estimate_noise_level
               (YV12_BUFFER_CONFIG *frame,double *noise_level,int plane_from,int plane_to,
               int bit_depth,int edge_thresh)

{
  int height_00;
  int width_00;
  int stride_00;
  uint8_t *puVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  int in_R8D;
  int in_R9D;
  bool bVar3;
  double dVar4;
  int is_high_bitdepth;
  uint16_t *src16;
  uint8_t *src;
  int stride;
  int width;
  int height;
  _Bool is_uv_plane;
  int plane;
  int local_24;
  
  for (local_24 = in_EDX; local_24 <= in_ECX; local_24 = local_24 + 1) {
    bVar3 = local_24 != 0;
    height_00 = *(int *)((long)in_RDI->store_buf_adr + (ulong)bVar3 * 4 + -0x30);
    width_00 = *(int *)((long)in_RDI->store_buf_adr + (ulong)bVar3 * 4 + -0x38);
    stride_00 = *(int *)((long)in_RDI->store_buf_adr + (ulong)bVar3 * 4 + -0x28);
    puVar1 = in_RDI->store_buf_adr[(long)local_24 + -4];
    iVar2 = is_frame_high_bitdepth(in_RDI);
    if (iVar2 == 0) {
      dVar4 = (*av1_estimate_noise_from_single_plane)(puVar1,height_00,width_00,stride_00,in_R9D);
      *(double *)(in_RSI + (long)local_24 * 8) = dVar4;
    }
    else {
      dVar4 = av1_highbd_estimate_noise_from_single_plane_c
                        ((uint16_t *)((long)puVar1 << 1),height_00,width_00,stride_00,in_R8D,in_R9D)
      ;
      *(double *)(in_RSI + (long)local_24 * 8) = dVar4;
    }
  }
  return;
}

Assistant:

void av1_estimate_noise_level(const YV12_BUFFER_CONFIG *frame,
                              double *noise_level, int plane_from, int plane_to,
                              int bit_depth, int edge_thresh) {
  for (int plane = plane_from; plane <= plane_to; plane++) {
    const bool is_uv_plane = (plane != AOM_PLANE_Y);
    const int height = frame->crop_heights[is_uv_plane];
    const int width = frame->crop_widths[is_uv_plane];
    const int stride = frame->strides[is_uv_plane];
    const uint8_t *src = frame->buffers[plane];

#if CONFIG_AV1_HIGHBITDEPTH
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    const int is_high_bitdepth = is_frame_high_bitdepth(frame);
    if (is_high_bitdepth) {
      noise_level[plane] = av1_highbd_estimate_noise_from_single_plane(
          src16, height, width, stride, bit_depth, edge_thresh);
    } else {
      noise_level[plane] = av1_estimate_noise_from_single_plane(
          src, height, width, stride, edge_thresh);
    }
#else
    (void)bit_depth;
    noise_level[plane] = av1_estimate_noise_from_single_plane(
        src, height, width, stride, edge_thresh);
#endif
  }
}